

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O3

int __thiscall Threadpool<Searchthread>::init(Threadpool<Searchthread> *this,EVP_PKEY_CTX *ctx)

{
  pointer ppSVar1;
  bool bVar2;
  uint uVar3;
  Searchthread *this_00;
  undefined7 extraout_var;
  uint uVar5;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  Searchthread *local_38;
  code *pcVar4;
  
  exit(this,(int)ctx);
  ppSVar1 = (this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  LOCK();
  (this->busy).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->processed).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->stop)._M_base._M_i = false;
  UNLOCK();
  uVar5 = 0;
  uVar3 = *(uint *)ctx;
  this->num_threads = uVar3;
  if (uVar3 != 0) {
    do {
      this_00 = (Searchthread *)operator_new(0x70);
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58._M_unused._M_object = operator_new(0x18);
      *(code **)local_58._M_unused._0_8_ = thread_func;
      *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
      *(Threadpool<Searchthread> **)((long)local_58._M_unused._0_8_ + 0x10) = this;
      pcStack_40 = std::
                   _Function_handler<void_(),_std::_Bind<void_(Threadpool<Searchthread>::*(Threadpool<Searchthread>_*))()>_>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(),_std::_Bind<void_(Threadpool<Searchthread>::*(Threadpool<Searchthread>_*))()>_>
                 ::_M_manager;
      Searchthread::Searchthread(this_00,(function<void_()> *)&local_58);
      local_38 = this_00;
      std::vector<Searchthread*,std::allocator<Searchthread*>>::emplace_back<Searchthread*>
                ((vector<Searchthread*,std::allocator<Searchthread*>> *)this,&local_38);
      pcVar4 = local_48;
      if (local_48 != (code *)0x0) {
        bVar2 = (*local_48)(&local_58,&local_58,__destroy_functor);
        pcVar4 = (code *)CONCAT71(extraout_var,bVar2);
      }
      uVar3 = (uint)pcVar4;
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->num_threads);
  }
  return uVar3;
}

Assistant:

void init(const int& numThreads) {

		// Clear any existing work..
		exit();
		workers.clear();

		busy = 0;
		processed = 0;
		stop = false;
		num_threads = numThreads;

		for (unsigned int i = 0; i < num_threads; ++i)
			workers.emplace_back(new T(std::bind(&Threadpool<T>::thread_func, this)));
	}